

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::operator*(mat4 *__return_storage_ptr__,float_t s,mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = m->m[0].y;
  fVar2 = m->m[0].z;
  fVar3 = m->m[0].w;
  fVar4 = m->m[1].x;
  fVar5 = m->m[1].y;
  fVar6 = m->m[1].z;
  fVar7 = m->m[1].w;
  fVar8 = m->m[2].x;
  fVar9 = m->m[2].y;
  fVar10 = m->m[2].z;
  fVar11 = m->m[2].w;
  fVar12 = m->m[3].x;
  fVar13 = m->m[3].y;
  fVar14 = m->m[3].z;
  fVar15 = m->m[3].w;
  __return_storage_ptr__->m[0].x = m->m[0].x * s;
  __return_storage_ptr__->m[0].y = fVar1 * s;
  __return_storage_ptr__->m[0].z = fVar2 * s;
  __return_storage_ptr__->m[0].w = fVar3 * s;
  __return_storage_ptr__->m[1].x = fVar4 * s;
  __return_storage_ptr__->m[1].y = fVar5 * s;
  __return_storage_ptr__->m[1].z = fVar6 * s;
  __return_storage_ptr__->m[1].w = fVar7 * s;
  __return_storage_ptr__->m[2].x = fVar8 * s;
  __return_storage_ptr__->m[2].y = fVar9 * s;
  __return_storage_ptr__->m[2].z = fVar10 * s;
  __return_storage_ptr__->m[2].w = fVar11 * s;
  __return_storage_ptr__->m[3].x = fVar12 * s;
  __return_storage_ptr__->m[3].y = fVar13 * s;
  __return_storage_ptr__->m[3].z = fVar14 * s;
  __return_storage_ptr__->m[3].w = s * fVar15;
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const float_t s, const mat4& m)
{
    return mat4(s * m[0], s * m[1], s * m[2], s * m[3]);
}